

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockBuilderVisitor.cpp
# Opt level: O2

void __thiscall
IRT::BlockBuilderVisitor::Visit
          (BlockBuilderVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  Label *this_00;
  Statement *root;
  ConditionalBlock *this_01;
  mapped_type *ppBVar1;
  string local_b0;
  Label local_90;
  Label local_70;
  Label local_50;
  
  this_01 = (ConditionalBlock *)operator_new(0x80);
  this_00 = &this->current_label_;
  std::__cxx11::string::string((string *)&local_50,(string *)this_00);
  root = this->current_root_;
  std::__cxx11::string::string
            ((string *)&local_70,(string *)&jump_conditional_statement->label_true_);
  std::__cxx11::string::string
            ((string *)&local_90,(string *)&jump_conditional_statement->label_false_);
  ConditionalBlock::ConditionalBlock(this_01,&local_50,root,&local_70,&local_90);
  Label::ToString_abi_cxx11_(&local_b0,this_00);
  ppBVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*>_>_>
            ::operator[](&this->blocks_,&local_b0);
  *ppBVar1 = (mapped_type)this_01;
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->root_block_ == (Block *)0x0) {
    Label::ToString_abi_cxx11_(&local_b0,this_00);
    ppBVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*>_>_>
              ::operator[](&this->blocks_,&local_b0);
    this->root_block_ = *ppBVar1;
    std::__cxx11::string::~string((string *)&local_b0);
  }
  (*(jump_conditional_statement->left_operand_->super_BaseElement)._vptr_BaseElement[2])
            (jump_conditional_statement->left_operand_,this);
  (*(jump_conditional_statement->right_operand_->super_BaseElement)._vptr_BaseElement[2])
            (jump_conditional_statement->right_operand_,this);
  return;
}

Assistant:

void BlockBuilderVisitor::Visit(
    JumpConditionalStatement *jump_conditional_statement) {
  blocks_[current_label_.ToString()] = new ConditionalBlock(
      current_label_, current_root_, jump_conditional_statement->label_true_,
      jump_conditional_statement->label_false_);

  if (root_block_ == nullptr) {
    root_block_ = blocks_[current_label_.ToString()];
  }

  jump_conditional_statement->left_operand_->Accept(this);
  jump_conditional_statement->right_operand_->Accept(this);
}